

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O2

void __thiscall
draco::PointAttribute::Init
          (PointAttribute *this,Type attribute_type,int8_t num_components,DataType data_type,
          bool normalized,size_t num_attribute_values)

{
  pointer pIVar1;
  int32_t iVar2;
  DataBuffer *pDVar3;
  pointer __p;
  __uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> local_38;
  
  pDVar3 = (DataBuffer *)operator_new(0x28);
  DataBuffer::DataBuffer(pDVar3);
  local_38._M_t.super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
  .super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl =
       (tuple<draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>)
       (_Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>)0x0;
  std::__uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>::reset
            ((__uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)
             &this->attribute_buffer_,pDVar3);
  std::unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>::~unique_ptr
            ((unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)&local_38);
  pDVar3 = (this->attribute_buffer_)._M_t.
           super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>._M_t.
           super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
           super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl;
  iVar2 = DataTypeLength(data_type);
  GeometryAttribute::Init
            (&this->super_GeometryAttribute,attribute_type,pDVar3,num_components,data_type,
             normalized,(long)(iVar2 * num_components),0);
  Reset(this,num_attribute_values);
  this->identity_mapping_ = true;
  pIVar1 = (this->indices_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->indices_map_).vector_.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar1) {
    (this->indices_map_).vector_.
    super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar1;
  }
  return;
}

Assistant:

void PointAttribute::Init(Type attribute_type, int8_t num_components,
                          DataType data_type, bool normalized,
                          size_t num_attribute_values) {
  attribute_buffer_ = std::unique_ptr<DataBuffer>(new DataBuffer());
  GeometryAttribute::Init(attribute_type, attribute_buffer_.get(),
                          num_components, data_type, normalized,
                          DataTypeLength(data_type) * num_components, 0);
  Reset(num_attribute_values);
  SetIdentityMapping();
}